

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpretdfd.c
# Opt level: O2

uint32_t bit_ceil(uint32_t x)

{
  uint uVar1;
  uint32_t i;
  int iVar2;
  
  iVar2 = 0;
  do {
    if (iVar2 == 0x20) {
      return 0;
    }
    uVar1 = 1 << ((byte)iVar2 & 0x1f);
    iVar2 = iVar2 + 1;
  } while (uVar1 <= x - 1);
  return uVar1;
}

Assistant:

static uint32_t bit_ceil(uint32_t x) {
    x -= 1;
    for (uint32_t i = 0; i < sizeof(x) * 8; ++i)
        if (1u << i > x)
            return 1u << i;
    return 0;
}